

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O0

void __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
::planeSplit(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
             *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                   *obj,unsigned_long *ind,unsigned_long count,int cutfeat,DistanceType *cutval,
            unsigned_long *lim1,unsigned_long *lim2)

{
  bool bVar1;
  ElementType EVar2;
  ulong local_48;
  unsigned_long right;
  unsigned_long left;
  DistanceType *cutval_local;
  int cutfeat_local;
  unsigned_long count_local;
  unsigned_long *ind_local;
  KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
  *obj_local;
  KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
  *this_local;
  
  right = 0;
  local_48 = count - 1;
  while( true ) {
    while( true ) {
      bVar1 = false;
      if (right <= local_48) {
        EVar2 = dataset_get(this,obj,ind[right],cutfeat);
        bVar1 = EVar2 < *cutval;
      }
      if (!bVar1) break;
      right = right + 1;
    }
    while( true ) {
      bVar1 = false;
      if ((local_48 != 0) && (bVar1 = false, right <= local_48)) {
        EVar2 = dataset_get(this,obj,ind[local_48],cutfeat);
        bVar1 = *cutval <= EVar2;
      }
      if (!bVar1) break;
      local_48 = local_48 - 1;
    }
    if ((local_48 < right) || (local_48 == 0)) break;
    std::swap<unsigned_long>(ind + right,ind + local_48);
    right = right + 1;
    local_48 = local_48 - 1;
  }
  *lim1 = right;
  local_48 = count - 1;
  while( true ) {
    while( true ) {
      bVar1 = false;
      if (right <= local_48) {
        EVar2 = dataset_get(this,obj,ind[right],cutfeat);
        bVar1 = EVar2 <= *cutval;
      }
      if (!bVar1) break;
      right = right + 1;
    }
    while( true ) {
      bVar1 = false;
      if ((local_48 != 0) && (bVar1 = false, right <= local_48)) {
        EVar2 = dataset_get(this,obj,ind[local_48],cutfeat);
        bVar1 = *cutval <= EVar2 && EVar2 != *cutval;
      }
      if (!bVar1) break;
      local_48 = local_48 - 1;
    }
    if ((local_48 < right) || (local_48 == 0)) break;
    std::swap<unsigned_long>(ind + right,ind + local_48);
    right = right + 1;
    local_48 = local_48 - 1;
  }
  *lim2 = right;
  return;
}

Assistant:

void planeSplit(Derived &obj, IndexType *ind, const IndexType count,
                  int cutfeat, DistanceType &cutval, IndexType &lim1,
                  IndexType &lim2) {
    /* Move vector indices for left subtree to front of list. */
    IndexType left = 0;
    IndexType right = count - 1;
    for (;;) {
      while (left <= right && dataset_get(obj, ind[left], cutfeat) < cutval)
        ++left;
      while (right && left <= right &&
             dataset_get(obj, ind[right], cutfeat) >= cutval)
        --right;
      if (left > right || !right)
        break; // "!right" was added to support unsigned Index types
      std::swap(ind[left], ind[right]);
      ++left;
      --right;
    }
    /* If either list is empty, it means that all remaining features
     * are identical. Split in the middle to maintain a balanced tree.
     */
    lim1 = left;
    right = count - 1;
    for (;;) {
      while (left <= right && dataset_get(obj, ind[left], cutfeat) <= cutval)
        ++left;
      while (right && left <= right &&
             dataset_get(obj, ind[right], cutfeat) > cutval)
        --right;
      if (left > right || !right)
        break; // "!right" was added to support unsigned Index types
      std::swap(ind[left], ind[right]);
      ++left;
      --right;
    }
    lim2 = left;
  }